

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O1

void __thiscall
fasttext::NegativeSamplingLoss::NegativeSamplingLoss
          (NegativeSamplingLoss *this,shared_ptr<fasttext::Matrix> *wo,int neg,
          vector<long,_std::allocator<long>_> *targetCounts)

{
  iterator __position;
  pointer piVar1;
  pointer piVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  pointer plVar5;
  long lVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 extraout_var [56];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM4_Qb;
  float local_3c;
  int local_34;
  undefined1 extraout_var_00 [56];
  
  Loss::Loss((Loss *)this,wo);
  (this->super_BinaryLogisticLoss).super_Loss._vptr_Loss =
       (_func_int **)&PTR__NegativeSamplingLoss_0013bb68;
  this->neg_ = neg;
  (this->negatives_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->negatives_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->negatives_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->uniform_)._M_param._M_a = 0;
  (this->uniform_)._M_param._M_b = 0xffffffffffffffff;
  plVar5 = (targetCounts->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((targetCounts->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
      super__Vector_impl_data._M_finish == plVar5) {
    local_3c = 0.0;
  }
  else {
    local_3c = 0.0;
    uVar7 = 0;
    auVar13 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
    do {
      auVar8._0_8_ = (double)plVar5[uVar7];
      auVar8._8_8_ = in_XMM4_Qb;
      if (auVar8._0_8_ < 0.0) {
        auVar13._0_8_ = sqrt(auVar8._0_8_);
        auVar13._8_56_ = extraout_var;
        auVar8 = auVar13._0_16_;
        auVar13 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
      }
      else {
        auVar8 = vsqrtsd_avx(auVar8,auVar8);
      }
      auVar8 = vandpd_avx(auVar8,auVar13._0_16_);
      local_3c = (float)(auVar8._0_8_ + (double)local_3c);
      uVar7 = uVar7 + 1;
      plVar5 = (targetCounts->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar7 < (ulong)((long)(targetCounts->super__Vector_base<long,_std::allocator<long>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)plVar5 >> 3));
  }
  plVar5 = (targetCounts->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((targetCounts->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
      super__Vector_impl_data._M_finish != plVar5) {
    uVar7 = 0;
    do {
      auVar10._0_8_ = (double)plVar5[uVar7];
      auVar10._8_8_ = in_XMM4_Qb;
      if (auVar10._0_8_ < 0.0) {
        auVar12._0_8_ = sqrt(auVar10._0_8_);
        auVar12._8_56_ = extraout_var_00;
        auVar8 = auVar12._0_16_;
      }
      else {
        auVar8 = vsqrtsd_avx(auVar10,auVar10);
      }
      auVar11._0_4_ = (float)auVar8._0_8_;
      auVar11._4_12_ = auVar8._4_12_;
      auVar3._8_4_ = 0x7fffffff;
      auVar3._0_8_ = 0x7fffffff7fffffff;
      auVar3._12_4_ = 0x7fffffff;
      auVar8 = vandps_avx512vl(auVar11,auVar3);
      fVar9 = (auVar8._0_4_ * 1e+07) / local_3c;
      if (0.0 < fVar9) {
        lVar6 = 1;
        do {
          local_34 = (int)uVar7;
          __position._M_current =
               (this->negatives_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->negatives_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&this->negatives_,__position,&local_34);
          }
          else {
            *__position._M_current = local_34;
            (this->negatives_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
          auVar4._8_8_ = in_XMM4_Qb;
          auVar4._0_8_ = in_XMM4_Qa;
          auVar8 = vcvtusi2ss_avx512f(auVar4,lVar6);
          lVar6 = lVar6 + 1;
        } while (auVar8._0_4_ < fVar9);
      }
      uVar7 = uVar7 + 1;
      plVar5 = (targetCounts->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar7 < (ulong)((long)(targetCounts->super__Vector_base<long,_std::allocator<long>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)plVar5 >> 3));
  }
  piVar1 = (this->negatives_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar2 = (this->negatives_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->uniform_)._M_param._M_a = 0;
  (this->uniform_)._M_param._M_b = ((long)piVar1 - (long)piVar2 >> 2) - 1;
  return;
}

Assistant:

NegativeSamplingLoss::NegativeSamplingLoss(
    std::shared_ptr<Matrix>& wo,
    int neg,
    const std::vector<int64_t>& targetCounts)
    : BinaryLogisticLoss(wo), neg_(neg), negatives_(), uniform_() {
  real z = 0.0;
  for (size_t i = 0; i < targetCounts.size(); i++) {
    z += pow(targetCounts[i], 0.5);
  }
  for (size_t i = 0; i < targetCounts.size(); i++) {
    real c = pow(targetCounts[i], 0.5);
    for (size_t j = 0; j < c * NegativeSamplingLoss::NEGATIVE_TABLE_SIZE / z;
         j++) {
      negatives_.push_back(i);
    }
  }
  uniform_ = std::uniform_int_distribution<size_t>(0, negatives_.size() - 1);
}